

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandReporter.cpp
# Opt level: O2

string * __thiscall
ApprovalTests::CommandReporter::getCommandLine
          (string *__return_storage_ptr__,CommandReporter *this,string *received,string *approved)

{
  CommandLauncher *pCVar1;
  string sStack_38;
  
  pCVar1 = this->l;
  assembleFullCommand(&sStack_38,this,received,approved);
  (*pCVar1->_vptr_CommandLauncher[3])(__return_storage_ptr__,pCVar1,&sStack_38);
  ::std::__cxx11::string::~string((string *)&sStack_38);
  return __return_storage_ptr__;
}

Assistant:

std::string CommandReporter::getCommandLine(const std::string& received,
                                                const std::string& approved) const
    {
        return l->getCommandLine(assembleFullCommand(received, approved));
    }